

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QRect __thiscall QRenderRule::paddingRect(QRenderRule *this,QRect *r)

{
  QStyleSheetBorderData *pQVar1;
  Representation RVar2;
  Representation RVar3;
  Representation RVar4;
  QRect QVar5;
  
  QVar5 = borderRect(this,r);
  pQVar1 = (this->bd).d.ptr;
  if (pQVar1 != (QStyleSheetBorderData *)0x0) {
    RVar2 = QVar5.x1.m_i;
    RVar3 = QVar5.x2.m_i;
    RVar4 = QVar5.y2.m_i;
    QVar5.y1.m_i = QVar5.y1.m_i.m_i + pQVar1->borders[0];
    QVar5.x1.m_i = pQVar1->borders[3] + RVar2.m_i;
    QVar5.y2.m_i = RVar4.m_i - pQVar1->borders[2];
    QVar5.x2.m_i = RVar3.m_i - pQVar1->borders[1];
  }
  return QVar5;
}

Assistant:

QRect QRenderRule::paddingRect(const QRect& r) const
{
    QRect br = borderRect(r);
    if (!hasBorder())
        return br;
    const int *b = border()->borders;
    return br.adjusted(b[LeftEdge], b[TopEdge], -b[RightEdge], -b[BottomEdge]);
}